

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

void write_hierarchy(bsdtar *bsdtar,archive *a,char *path)

{
  archive *_a;
  FILE *f;
  wchar_t wVar1;
  int iVar2;
  int code;
  mode_t mVar3;
  char *pcVar4;
  archive_entry *paVar5;
  archive_entry *entry;
  archive_entry *spare_entry;
  archive_entry *local_40;
  archive_entry *local_38;
  
  _a = bsdtar->diskreader;
  local_40 = (archive_entry *)0x0;
  local_38 = (archive_entry *)0x0;
  wVar1 = archive_read_disk_open(_a,path);
  if (wVar1 == L'\0') {
    bsdtar->first_fs = -1;
    paVar5 = (archive_entry *)0x0;
LAB_001100c2:
    archive_entry_free(paVar5);
    local_40 = archive_entry_new();
    iVar2 = archive_read_next_header2(_a,local_40);
    if (iVar2 == 0) goto LAB_0011012b;
    if (iVar2 != 1) {
      code = archive_errno(_a);
      pcVar4 = archive_error_string(_a);
      lafe_warnc(code,"%s",pcVar4);
      if ((iVar2 != -0x19) && (iVar2 != -0x1e)) goto code_r0x00110121;
      bsdtar->return_value = 1;
    }
    archive_entry_free(local_40);
    archive_read_close(_a);
  }
  else {
    iVar2 = archive_errno(_a);
    pcVar4 = archive_error_string(_a);
    lafe_warnc(iVar2,"%s",pcVar4);
    bsdtar->return_value = 1;
  }
  return;
code_r0x00110121:
  paVar5 = local_40;
  if (-0x15 < iVar2) {
LAB_0011012b:
    if ((-1 < (long)bsdtar->uid) &&
       (archive_entry_set_uid(local_40,(long)bsdtar->uid), paVar5 = local_40,
       bsdtar->uname == (char *)0x0)) {
      pcVar4 = archive_read_disk_uname(bsdtar->diskreader,(long)bsdtar->uid);
      archive_entry_set_uname(paVar5,pcVar4);
    }
    if ((-1 < (long)bsdtar->gid) &&
       (archive_entry_set_gid(local_40,(long)bsdtar->gid), paVar5 = local_40,
       bsdtar->gname == (char *)0x0)) {
      pcVar4 = archive_read_disk_gname(bsdtar->diskreader,(long)bsdtar->gid);
      archive_entry_set_gname(paVar5,pcVar4);
    }
    if (bsdtar->uname != (char *)0x0) {
      archive_entry_set_uname(local_40,bsdtar->uname);
    }
    if (bsdtar->gname != (char *)0x0) {
      archive_entry_set_gname(local_40,bsdtar->gname);
    }
    wVar1 = edit_pathname(bsdtar,local_40);
    f = _stderr;
    paVar5 = local_40;
    if (wVar1 == L'\0') {
      if (bsdtar->verbose < 2) {
        if (bsdtar->verbose == 1) {
          pcVar4 = archive_entry_pathname(local_40);
          safe_fprintf((FILE_conflict *)f,"a %s",pcVar4);
        }
      }
      else {
        safe_fprintf((FILE_conflict *)_stderr,"a ");
        list_item_verbose(bsdtar,(FILE_conflict *)_stderr,local_40);
      }
      mVar3 = archive_entry_filetype(local_40);
      if (mVar3 != 0x8000) {
        archive_entry_set_size(local_40,0);
      }
      archive_entry_linkify(bsdtar->resolver,&local_40,&local_38);
      while (local_40 != (archive_entry *)0x0) {
        write_file(bsdtar,a,local_40);
        paVar5 = local_38;
        if (local_40 != local_38) {
          archive_entry_free(local_40);
          paVar5 = local_38;
        }
        local_38 = (archive_entry *)0x0;
        local_40 = paVar5;
      }
      paVar5 = local_40;
      if (bsdtar->verbose != 0) {
        fputc(10,_stderr);
        paVar5 = local_40;
      }
    }
  }
  goto LAB_001100c2;
}

Assistant:

static void
write_hierarchy(struct bsdtar *bsdtar, struct archive *a, const char *path)
{
	struct archive *disk = bsdtar->diskreader;
	struct archive_entry *entry = NULL, *spare_entry = NULL;
	int r;

	r = archive_read_disk_open(disk, path);
	if (r != ARCHIVE_OK) {
		lafe_warnc(archive_errno(disk),
		    "%s", archive_error_string(disk));
		bsdtar->return_value = 1;
		return;
	}
	bsdtar->first_fs = -1;

	for (;;) {
		archive_entry_free(entry);
		entry = archive_entry_new();
		r = archive_read_next_header2(disk, entry);
		if (r == ARCHIVE_EOF)
			break;
		else if (r != ARCHIVE_OK) {
			lafe_warnc(archive_errno(disk),
			    "%s", archive_error_string(disk));
			if (r == ARCHIVE_FATAL || r == ARCHIVE_FAILED) {
				bsdtar->return_value = 1;
				archive_entry_free(entry);
				archive_read_close(disk);
				return;
			} else if (r < ARCHIVE_WARN)
				continue;
		}

		if (bsdtar->uid >= 0) {
			archive_entry_set_uid(entry, bsdtar->uid);
			if (!bsdtar->uname)
				archive_entry_set_uname(entry,
				    archive_read_disk_uname(bsdtar->diskreader,
					bsdtar->uid));
		}
		if (bsdtar->gid >= 0) {
			archive_entry_set_gid(entry, bsdtar->gid);
			if (!bsdtar->gname)
				archive_entry_set_gname(entry,
				    archive_read_disk_gname(bsdtar->diskreader,
					bsdtar->gid));
		}
		if (bsdtar->uname)
			archive_entry_set_uname(entry, bsdtar->uname);
		if (bsdtar->gname)
			archive_entry_set_gname(entry, bsdtar->gname);

		/*
		 * Rewrite the pathname to be archived.  If rewrite
		 * fails, skip the entry.
		 */
		if (edit_pathname(bsdtar, entry))
			continue;

		/* Display entry as we process it. */
		if (bsdtar->verbose > 1) {
			safe_fprintf(stderr, "a ");
			list_item_verbose(bsdtar, stderr, entry);
		} else if (bsdtar->verbose > 0) {
		/* This format is required by SUSv2. */
			safe_fprintf(stderr, "a %s",
			    archive_entry_pathname(entry));
		}

		/* Non-regular files get archived with zero size. */
		if (archive_entry_filetype(entry) != AE_IFREG)
			archive_entry_set_size(entry, 0);

		archive_entry_linkify(bsdtar->resolver, &entry, &spare_entry);

		while (entry != NULL) {
			write_file(bsdtar, a, entry);
			if (entry != spare_entry) {
				archive_entry_free(entry);
			}
			entry = spare_entry;
			spare_entry = NULL;
		}

		if (bsdtar->verbose)
			fprintf(stderr, "\n");
	}
	archive_entry_free(entry);
	archive_read_close(disk);
}